

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O3

Type * __thiscall
slang::ast::builtins::SdfAnnotateTask::checkArguments
          (SdfAnnotateTask *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_4)

{
  Compilation *pCVar1;
  bool bVar2;
  ulong uVar3;
  Type *pTVar4;
  ulong uVar5;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar2 = SystemSubroutine::checkArgCount((SystemSubroutine *)this,context,false,args,range,1,7);
  if (bVar2) {
    uVar3 = (args->_M_extent)._M_extent_value;
    if (uVar3 != 0) {
      uVar5 = 0;
      do {
        if (uVar5 != 1) {
          bVar2 = Type::canBeStringLike(((*args->_M_ptr)->type).ptr);
          if (!bVar2) {
            pTVar4 = SystemSubroutine::badArg((SystemSubroutine *)this,context,args->_M_ptr[uVar5]);
            return pTVar4;
          }
          uVar3 = (args->_M_extent)._M_extent_value;
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < uVar3);
    }
    pTVar4 = pCVar1->voidType;
  }
  else {
    pTVar4 = pCVar1->errorType;
  }
  return pTVar4;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 1, 7))
            return comp.getErrorType();

        for (size_t i = 0; i < args.size(); i++) {
            if (i != 1 && !args[0]->type->canBeStringLike())
                return badArg(context, *args[i]);
        }

        return comp.getVoidType();
    }